

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

void __thiscall
Js::WebAssemblyModule::AddTableImport
          (WebAssemblyModule *this,char16 *modName,uint32 modNameLen,char16 *importName,
          uint32 importNameLen)

{
  int iVar1;
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  WasmImport *pWVar2;
  
  pWVar2 = (WasmImport *)new<Memory::ArenaAllocator>(0x20,this->m_alloc,0x364470);
  pWVar2->kind = Function;
  *(undefined3 *)&pWVar2->field_0x1 = 0;
  pWVar2->modNameLen = 0;
  pWVar2->modName = (char16 *)0x0;
  *(undefined8 *)&pWVar2->importNameLen = 0;
  pWVar2->kind = Table;
  pWVar2->importName = importName;
  pWVar2->importNameLen = importNameLen;
  pWVar2->modName = modName;
  pWVar2->modNameLen = modNameLen;
  this_00 = (this->m_imports).ptr;
  JsUtil::
  List<Wasm::WasmImport_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(this_00,0);
  iVar1 = (this_00->super_ReadOnlyList<Wasm::WasmImport_*,_Memory::ArenaAllocator,_DefaultComparer>)
          .count;
  (this_00->super_ReadOnlyList<Wasm::WasmImport_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
  [iVar1] = pWVar2;
  (this_00->super_ReadOnlyList<Wasm::WasmImport_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
       iVar1 + 1;
  Memory::Recycler::WBSetBit((char *)&this->m_tableImport);
  (this->m_tableImport).ptr = pWVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_tableImport);
  return;
}

Assistant:

void
WebAssemblyModule::AddTableImport(const char16* modName, uint32 modNameLen, const char16* importName, uint32 importNameLen)
{
    Wasm::WasmImport* wi = Anew(m_alloc, Wasm::WasmImport);
    wi->kind = Wasm::ExternalKinds::Table;
    wi->importName = importName;
    wi->importNameLen = importNameLen;
    wi->modName = modName;
    wi->modNameLen = modNameLen;
    m_imports->Add(wi);
    m_tableImport = wi;
}